

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O3

void OPN2_GenerateResampled(ym3438_t *chip,Bit16s *buf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Bit16s buffer [2];
  short local_1c;
  short local_1a;
  
  iVar4 = chip->rateratio;
  iVar3 = chip->samplecnt;
  if (iVar3 < iVar4) {
    iVar1 = chip->samples[0];
    iVar2 = chip->samples[1];
  }
  else {
    iVar1 = chip->samples[0];
    iVar2 = chip->samples[1];
    do {
      chip->oldsamples[0] = iVar1;
      chip->oldsamples[1] = iVar2;
      OPN2_Generate(chip,&local_1c);
      iVar1 = local_1c * 0xb;
      chip->samples[0] = iVar1;
      iVar2 = local_1a * 0xb;
      chip->samples[1] = iVar2;
      iVar4 = chip->rateratio;
      iVar3 = chip->samplecnt - iVar4;
      chip->samplecnt = iVar3;
    } while (iVar4 <= iVar3);
  }
  *buf = (Bit16s)((ulong)((long)(iVar1 * iVar3 + chip->oldsamples[0] * (iVar4 - iVar3)) /
                         (long)iVar4) >> 1);
  buf[1] = (Bit16s)((ulong)((long)(iVar2 * iVar3 + (iVar4 - iVar3) * chip->oldsamples[1]) /
                           (long)iVar4) >> 1);
  chip->samplecnt = iVar3 + 0x400;
  return;
}

Assistant:

void OPN2_GenerateResampled(ym3438_t *chip, Bit16s *buf)
{
    Bit16s buffer[2];

    while (chip->samplecnt >= chip->rateratio)
    {
        chip->oldsamples[0] = chip->samples[0];
        chip->oldsamples[1] = chip->samples[1];
        OPN2_Generate(chip, buffer);
        chip->samples[0] = buffer[0] * 11;
        chip->samples[1] = buffer[1] * 11;
        chip->samplecnt -= chip->rateratio;
    }
    buf[0] = (Bit16s)(((chip->oldsamples[0] * (chip->rateratio - chip->samplecnt)
                     + chip->samples[0] * chip->samplecnt) / chip->rateratio)>>1);
    buf[1] = (Bit16s)(((chip->oldsamples[1] * (chip->rateratio - chip->samplecnt)
                     + chip->samples[1] * chip->samplecnt) / chip->rateratio)>>1);
    chip->samplecnt += 1 << RSM_FRAC;
}